

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiddle~.c
# Opt level: O2

void sigfiddle_bang(t_sigfiddle *x)

{
  float f;
  t_peakout *ptVar1;
  long lVar2;
  int iVar3;
  t_pitchhist *ptVar4;
  t_float *ptVar5;
  t_atomtype tVar6;
  t_atom at [3];
  
  iVar3 = x->x_npeakout;
  tVar6 = A_FLOAT;
  if (iVar3 != 0) {
    ptVar1 = x->x_peakbuf;
    lVar2 = 0;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    while (iVar3 != (int)lVar2) {
      at[0].a_w._0_4_ = (undefined4)(int)(lVar2 + 1);
      at[1].a_w._0_4_ = ptVar1[lVar2].po_freq;
      at[2].a_w._0_4_ = ptVar1[lVar2].po_amp;
      at[0].a_type = tVar6;
      at[1].a_type = tVar6;
      at[2].a_type = tVar6;
      outlet_list((_outlet *)x->x_peakout,(t_symbol *)0x0,3,at);
      lVar2 = lVar2 + 1;
    }
  }
  outlet_float((_outlet *)x->x_envout,x->x_dbs[x->x_histphase]);
  ptVar4 = x->x_hist;
  ptVar5 = x->x_hist[0].h_pitches;
  for (iVar3 = 0; iVar3 < x->x_npitch; iVar3 = iVar3 + 1) {
    at[0].a_w._0_4_ = ptVar5[x->x_histphase];
    at[1].a_w._0_4_ = ptVar5[(long)x->x_histphase + -0x14];
    at[0].a_type = tVar6;
    at[1].a_type = tVar6;
    outlet_list(*(_outlet **)(ptVar5 + 0x19),(t_symbol *)0x0,2,at);
    ptVar5 = ptVar5 + 0x30;
  }
  if (x->x_attackvalue != 0) {
    outlet_bang((_outlet *)x->x_attackout);
  }
  for (iVar3 = 0; iVar3 < x->x_npitch; iVar3 = iVar3 + 1) {
    f = ptVar4->h_pitch;
    if ((f != 0.0) || (NAN(f))) {
      outlet_float((_outlet *)x->x_noteout,f);
    }
    ptVar4 = ptVar4 + 1;
  }
  return;
}

Assistant:

void sigfiddle_bang(t_sigfiddle *x)
{
    int i;
    t_pitchhist *ph;
    if (x->x_npeakout)
    {
        int npeakout = x->x_npeakout;
        t_peakout *po;
        for (i = 0, po = x->x_peakbuf; i < npeakout; i++, po++)
        {
            t_atom at[3];
            SETFLOAT(at, i+1);
            SETFLOAT(at+1, po->po_freq);
            SETFLOAT(at+2, po->po_amp);
            outlet_list(x->x_peakout, 0, 3, at);
        }
    }
    outlet_float(x->x_envout, x->x_dbs[x->x_histphase]);
    for (i = 0,  ph = x->x_hist; i < x->x_npitch; i++,  ph++)
    {
        t_atom at[2];
        SETFLOAT(at, ph->h_pitches[x->x_histphase]);
        SETFLOAT(at+1, ph->h_amps[x->x_histphase]);
        outlet_list(ph->h_outlet, 0, 2, at);
    }
    if (x->x_attackvalue) outlet_bang(x->x_attackout);
    for (i = 0,  ph = x->x_hist; i < x->x_npitch; i++,  ph++)
        if (ph->h_pitch) outlet_float(x->x_noteout, ph->h_pitch);
}